

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::IsIPOEnabled(cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  char *pcVar5;
  long *plVar6;
  cmake *pcVar7;
  ostream *poVar8;
  string *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  PolicyID id;
  char cVar11;
  ostringstream w;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1a8._M_allocated_capacity = (size_type)local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_1b8 + 0x10),"INTERPROCEDURAL_OPTIMIZATION","");
  pcVar5 = GetFeature(this,(string *)(local_1b8 + 0x10),config);
  bVar2 = cmSystemTools::IsOn(pcVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_allocated_capacity != local_198) {
    operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     (((iVar3 = std::__cxx11::string::compare((char *)lang), iVar3 == 0 ||
       (iVar3 = std::__cxx11::string::compare((char *)lang), iVar3 == 0)) ||
      (iVar3 = std::__cxx11::string::compare((char *)lang), iVar3 == 0)))) {
    PVar4 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0069);
    pcVar1 = this->Makefile;
    if (WARN < PVar4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     "_CMAKE_",lang);
      plVar6 = (long *)std::__cxx11::string::append(local_1d8);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar10) {
        local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_198[0]._8_8_ = plVar6[3];
        local_1a8._M_allocated_capacity = (size_type)local_198;
      }
      else {
        local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_1a8._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar6;
      }
      local_1a8._8_8_ = plVar6[1];
      *plVar6 = (long)paVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      bVar2 = cmMakefile::IsOn(pcVar1,(string *)(local_1b8 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity,
                        local_198[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
        operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
      }
      if (bVar2) {
        pcVar1 = this->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8,"_CMAKE_",lang);
        plVar6 = (long *)std::__cxx11::string::append(local_1d8);
        local_1a8._M_allocated_capacity = (size_type)local_198;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar10) {
          local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
          local_198[0]._8_8_ = plVar6[3];
        }
        else {
          local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
          local_1a8._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar6;
        }
        local_1a8._8_8_ = plVar6[1];
        *plVar6 = (long)paVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        bVar2 = cmMakefile::IsOn(pcVar1,(string *)(local_1b8 + 0x10));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          local_198[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
        }
        if (bVar2) {
          iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
          pcVar5 = (char *)0x0;
          cVar11 = (char)iVar3;
          if (cVar11 == '\0') {
            pcVar5 = "CMake doesn\'t support IPO for current generator";
          }
        }
        else {
          pcVar5 = "Compiler doesn\'t support IPO";
          cVar11 = '\0';
        }
      }
      else {
        pcVar5 = "CMake doesn\'t support IPO for current compiler";
        cVar11 = '\0';
      }
      if (cVar11 != '\0') {
        return (bool)cVar11;
      }
      if (this->PolicyReportedCMP0069 != false) {
        return false;
      }
      this->PolicyReportedCMP0069 = true;
      pcVar7 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_1b8 + 0x10),pcVar5,(allocator<char> *)local_1b8);
      GetBacktrace((cmGeneratorTarget *)local_1d8);
      cmake::IssueMessage(pcVar7,FATAL_ERROR,(string *)(local_1b8 + 0x10),
                          (cmListFileBacktrace *)local_1d8);
      if ((cmMakefile *)local_1d8._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity == local_198) {
        return false;
      }
      operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1
                     );
      return false;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   "_CMAKE_",lang);
    plVar6 = (long *)std::__cxx11::string::append(local_1d8);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar10) {
      local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_198[0]._8_8_ = plVar6[3];
      local_1a8._M_allocated_capacity = (size_type)local_198;
    }
    else {
      local_198[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_1a8._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_1a8._8_8_ = plVar6[1];
    *plVar6 = (long)paVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    bVar2 = cmMakefile::IsOn(pcVar1,(string *)(local_1b8 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity != local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,local_198[0]._M_allocated_capacity + 1
                     );
    }
    pcVar5 = local_1d8 + 0x10;
    if ((char *)local_1d8._0_8_ != pcVar5) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
    if (bVar2) {
      return true;
    }
    if (this->PolicyReportedCMP0069 == false) {
      pcVar7 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      bVar2 = cmake::GetIsInTryCompile(pcVar7);
      if (PVar4 != WARN) {
        return false;
      }
      if (bVar2) {
        return false;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1d8,(cmPolicies *)0x45,id);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b8 + 0x10),(char *)local_1d8._0_8_,local_1d8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      if ((char *)local_1d8._0_8_ != pcVar5) {
        operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),
                 "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target ",0x41);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"\'",1);
      psVar9 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b8 + 0x10),(psVar9->_M_dataplus)._M_p,
                          psVar9->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'.",2);
      pcVar7 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)local_1b8);
      cmake::IssueMessage(pcVar7,AUTHOR_WARNING,(string *)local_1d8,(cmListFileBacktrace *)local_1b8
                         );
      if ((cmMakefile *)local_1b8._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
      }
      if ((char *)local_1d8._0_8_ != pcVar5) {
        operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
      }
      this->PolicyReportedCMP0069 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
      std::ios_base::~ios_base(local_138);
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::IsIPOEnabled(std::string const& lang,
                                     std::string const& config) const
{
  const char* feature = "INTERPROCEDURAL_OPTIMIZATION";
  const bool result = cmSystemTools::IsOn(this->GetFeature(feature, config));

  if (!result) {
    // 'INTERPROCEDURAL_OPTIMIZATION' is off, no need to check policies
    return false;
  }

  if (lang != "C" && lang != "CXX" && lang != "Fortran") {
    // We do not define IPO behavior for other languages.
    return false;
  }

  cmPolicies::PolicyStatus cmp0069 = this->GetPolicyStatusCMP0069();

  if (cmp0069 == cmPolicies::OLD || cmp0069 == cmPolicies::WARN) {
    if (this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_LEGACY_BEHAVIOR")) {
      return true;
    }
    if (this->PolicyReportedCMP0069) {
      // problem is already reported, no need to issue a message
      return false;
    }
    const bool in_try_compile =
      this->LocalGenerator->GetCMakeInstance()->GetIsInTryCompile();
    if (cmp0069 == cmPolicies::WARN && !in_try_compile) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0069) << "\n";
      w << "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
        << "'" << this->GetName() << "'.";
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, w.str(), this->GetBacktrace());

      this->PolicyReportedCMP0069 = true;
    }
    return false;
  }

  // Note: check consistency with messages from CheckIPOSupported
  const char* message = nullptr;
  if (!this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_SUPPORTED_BY_CMAKE")) {
    message = "CMake doesn't support IPO for current compiler";
  } else if (!this->Makefile->IsOn("_CMAKE_" + lang +
                                   "_IPO_MAY_BE_SUPPORTED_BY_COMPILER")) {
    message = "Compiler doesn't support IPO";
  } else if (!this->GlobalGenerator->IsIPOSupported()) {
    message = "CMake doesn't support IPO for current generator";
  }

  if (!message) {
    // No error/warning messages
    return true;
  }

  if (this->PolicyReportedCMP0069) {
    // problem is already reported, no need to issue a message
    return false;
  }

  this->PolicyReportedCMP0069 = true;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, message, this->GetBacktrace());
  return false;
}